

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O0

HighsStatus __thiscall Highs::writeBasis(Highs *this,string *filename)

{
  bool bVar1;
  HighsStatus HVar2;
  HighsLogOptions *log_options_;
  undefined8 uVar3;
  string *in_RSI;
  long in_RDI;
  HighsFileType file_type;
  FILE *file;
  HighsStatus call_status;
  HighsStatus return_status;
  HighsLogOptions *in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffec4;
  allocator *file_type_00;
  FILE **in_stack_fffffffffffffef0;
  string *in_stack_fffffffffffffef8;
  string *in_stack_ffffffffffffff00;
  HighsStatus in_stack_ffffffffffffff08;
  HighsStatus in_stack_ffffffffffffff0c;
  HighsLogOptions *in_stack_ffffffffffffff10;
  allocator local_71;
  string local_70 [32];
  string local_50 [40];
  FILE *local_28;
  HighsStatus local_20;
  HighsStatus local_1c;
  HighsStatus local_4;
  
  local_1c = 0;
  std::__cxx11::string::string(local_50,in_RSI);
  file_type_00 = &local_71;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_70,"writebasis",file_type_00);
  local_20 = openWriteFile((Highs *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                           in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,
                           in_stack_fffffffffffffef0,(HighsFileType *)file_type_00);
  std::__cxx11::string::~string(local_70);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  std::__cxx11::string::~string(local_50);
  HighsLogOptions::HighsLogOptions
            ((HighsLogOptions *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
             in_stack_fffffffffffffeb8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&stack0xfffffffffffffef8,"openWriteFile",
             (allocator *)&stack0xfffffffffffffef7);
  HVar2 = interpretCallStatus(in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c,
                              in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
  local_1c = HVar2;
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffef8);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffef7);
  HighsLogOptions::~HighsLogOptions((HighsLogOptions *)0x48805c);
  if (local_1c == kError) {
    local_4 = local_1c;
  }
  else {
    bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT44(HVar2,in_stack_fffffffffffffec0),
                            (char *)in_stack_fffffffffffffeb8);
    if (bVar1) {
      log_options_ = (HighsLogOptions *)(in_RDI + 0xe28);
      uVar3 = std::__cxx11::string::c_str();
      highsLogUser(log_options_,kInfo,"Writing the basis to %s\n",uVar3);
    }
    writeBasisFile(&in_stack_ffffffffffffff10->log_stream,
                   (HighsBasis *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
    if (local_28 != _stdout) {
      fclose(local_28);
    }
    local_4 = local_1c;
  }
  return local_4;
}

Assistant:

HighsStatus Highs::writeBasis(const std::string& filename) const {
  HighsStatus return_status = HighsStatus::kOk;
  HighsStatus call_status;
  FILE* file;
  HighsFileType file_type;
  call_status = openWriteFile(filename, "writebasis", file, file_type);
  return_status = interpretCallStatus(options_.log_options, call_status,
                                      return_status, "openWriteFile");
  if (return_status == HighsStatus::kError) return return_status;
  // Report to user that basis is being written
  if (filename != "")
    highsLogUser(options_.log_options, HighsLogType::kInfo,
                 "Writing the basis to %s\n", filename.c_str());
  writeBasisFile(file, basis_);
  if (file != stdout) fclose(file);
  return return_status;
}